

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte bVar1;
  bool bVar2;
  uhugeint_t *puVar3;
  uhugeint_t *puVar4;
  uhugeint_t *puVar5;
  byte in_CL;
  Vector *in_RDX;
  idx_t in_RSI;
  uhugeint_t uVar6;
  uhugeint_t *result_data;
  uhugeint_t *rdata;
  uhugeint_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  uhugeint_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)in_stack_ffffffffffffffb8.upper,in_stack_ffffffffffffffb8.lower._7_1_);
  puVar3 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0x12d3124);
  puVar4 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0x12d3133);
  puVar5 = ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0x12d3142);
  bVar2 = ConstantVector::IsNull((Vector *)0x12d3151);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x12d315f), !bVar2)) {
    mask = (ValidityMask *)puVar3->lower;
    fun_00 = (undefined1)(puVar3->upper >> 0x38);
    ConstantVector::Validity(in_RDX);
    uVar6.upper = (uint64_t)puVar4;
    uVar6.lower = (uint64_t)puVar5;
    uVar6 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::SubtractOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                      ((bool)fun_00,uVar6,in_stack_ffffffffffffffb8,mask,in_RSI);
    puVar5->lower = uVar6.lower;
    puVar5->upper = uVar6.upper;
    return;
  }
  ConstantVector::SetNull
            ((Vector *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),SUB81((ulong)puVar3 >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}